

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::ExtensionRangeOptions::Clear(ExtensionRangeOptions *this)

{
  void **ppvVar1;
  Rep *pRVar2;
  long lVar3;
  long lVar4;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  lVar4 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar4) {
    pRVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    lVar3 = 0;
    do {
      ppvVar1 = pRVar2->elements + lVar3;
      lVar3 = lVar3 + 1;
      UninterpretedOption::Clear((UninterpretedOption *)*ppvVar1);
    } while (lVar4 != lVar3);
    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void ExtensionRangeOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.ExtensionRangeOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  uninterpreted_option_.Clear();
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}